

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_layer.cpp
# Opt level: O0

ON__LayerPerViewSettings * __thiscall
ON__LayerExtensions::ViewportSettings
          (ON__LayerExtensions *this,ON_Layer *layer,uchar *layer_m_extension_bits,
          ON_UUID viewport_id,bool bCreate)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ON__LayerExtensions *pOVar4;
  ON__LayerPerViewSettings *pOVar5;
  ON__LayerPerViewSettings *pOVar6;
  ON__LayerPerViewSettings *new_vp_settings;
  ON__LayerPerViewSettings *vp_settings;
  int vp_settings_count;
  int i;
  ON__LayerExtensions *ud;
  bool bCreate_local;
  uchar *layer_m_extension_bits_local;
  ON_Layer *layer_local;
  ON_UUID viewport_id_local;
  
  viewport_id_local._0_8_ = viewport_id._0_8_;
  layer_local = (ON_Layer *)layer_m_extension_bits;
  bVar1 = ON_UuidIsNil((ON_UUID *)&layer_local);
  if ((!bVar1) &&
     (pOVar4 = LayerExtensions((ON_Layer *)this,(uchar *)layer,(bool)(viewport_id.Data4[0] & 1)),
     pOVar4 != (ON__LayerExtensions *)0x0)) {
    iVar2 = ON_SimpleArray<ON__LayerPerViewSettings>::Count(&pOVar4->m_vp_settings);
    pOVar5 = ON_SimpleArray<ON__LayerPerViewSettings>::Array(&pOVar4->m_vp_settings);
    for (vp_settings._4_4_ = 0; vp_settings._4_4_ < iVar2; vp_settings._4_4_ = vp_settings._4_4_ + 1
        ) {
      iVar3 = memcmp(&layer_local,pOVar5 + vp_settings._4_4_,0x10);
      if (iVar3 == 0) {
        return pOVar5 + vp_settings._4_4_;
      }
    }
    if (((undefined1  [16])viewport_id & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pOVar5 = ON_SimpleArray<ON__LayerPerViewSettings>::AppendNew(&pOVar4->m_vp_settings);
      pOVar6 = ON_SimpleArray<ON__LayerPerViewSettings>::Array(&pOVar4->m_vp_settings);
      ON__LayerPerViewSettings::SetDefaultValues(pOVar5);
      *(ON_Layer **)&pOVar5->m_viewport_id = layer_local;
      *(undefined8 *)(pOVar5->m_viewport_id).Data4 = viewport_id_local._0_8_;
      ON_SimpleArray<ON__LayerPerViewSettings>::QuickSort
                (&pOVar4->m_vp_settings,ON__LayerPerViewSettings::Compare);
      for (vp_settings._4_4_ = 0; vp_settings._4_4_ <= iVar2;
          vp_settings._4_4_ = vp_settings._4_4_ + 1) {
        iVar3 = memcmp(&layer_local,pOVar6 + vp_settings._4_4_,0x10);
        if (iVar3 == 0) {
          return pOVar6 + vp_settings._4_4_;
        }
      }
    }
  }
  return (ON__LayerPerViewSettings *)0x0;
}

Assistant:

ON__LayerPerViewSettings* ON__LayerExtensions::ViewportSettings( 
  const ON_Layer& layer,
  const unsigned char* layer_m_extension_bits,
  ON_UUID viewport_id,
  bool bCreate
  )
{
  if ( !ON_UuidIsNil(viewport_id) )
  {
    ON__LayerExtensions* ud = ON__LayerExtensions::LayerExtensions(layer,layer_m_extension_bits,bCreate);
    if ( ud )
    {
      int i;
      const int vp_settings_count = ud->m_vp_settings.Count();
      ON__LayerPerViewSettings* vp_settings = ud->m_vp_settings.Array();
      for ( i = 0; i < vp_settings_count; i++ )
      {
        if ( 0 == memcmp(&viewport_id,&vp_settings[i].m_viewport_id,sizeof(ON_UUID)) )
          return (vp_settings+i);
      }
      if ( bCreate )
      {
        ON__LayerPerViewSettings& new_vp_settings = ud->m_vp_settings.AppendNew();
        vp_settings = ud->m_vp_settings.Array(); // appending can grow the array
        new_vp_settings.SetDefaultValues();
        new_vp_settings.m_viewport_id = viewport_id;

        // to make ON_Layer::PerViewportSettingsCRC() return
        // equal values for equal settings, it is critical
        // that m_vp_settings[] be sorted.
        ud->m_vp_settings.QuickSort(ON__LayerPerViewSettings::Compare);

        for ( i = 0; i <= vp_settings_count; i++ ) // "i <= ..." is correct because of the .AppendNew()
        {
          if ( 0 == memcmp(&viewport_id,&vp_settings[i].m_viewport_id,sizeof(ON_UUID)) )
            return (vp_settings+i);
        }
      }
    }
  }
  return 0;
}